

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O0

void helics::valueExtract(data_view *data,DataType baseType,bool *val)

{
  string_view val_00;
  string_view val_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  long lVar2;
  invalid_argument *this;
  byte *in_RDX;
  int in_ESI;
  int in_EDI;
  double extraout_XMM0_Qa;
  double dVar3;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> value_4;
  complex<double> value_3;
  vector<double,_std::allocator<double>_> value_2;
  long value_1;
  double value;
  string *str;
  NamedPoint npval;
  defV val_dv;
  char *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe80;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vec;
  data_view *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  undefined5 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea5;
  undefined1 in_stack_fffffffffffffea6;
  undefined1 in_stack_fffffffffffffea7;
  bool bVar4;
  bool *in_stack_fffffffffffffeb8;
  defV *in_stack_fffffffffffffec0;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_118 [3];
  double local_d0;
  __sv_type local_c8;
  undefined1 *local_b8;
  undefined1 local_b0 [32];
  double local_90;
  defV *in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff88 [16];
  undefined1 auVar5 [12];
  
  auVar5 = in_stack_ffffffffffffff88._4_12_;
  if (in_ESI == 0) {
LAB_00427d07:
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::interpret
              ((data_view *)in_stack_fffffffffffffe70);
    val_00._M_str = in_stack_fffffffffffffe78;
    val_00._M_len = (size_t)in_stack_fffffffffffffe70;
    bVar1 = helicsBoolValue(val_00);
    *in_RDX = bVar1;
  }
  else {
    if (in_ESI == 1) {
      local_d0 = ValueConverter<double>::interpret((data_view *)in_stack_fffffffffffffe70);
      std::abs(in_EDI);
      *in_RDX = extraout_XMM0_Qa != 0.0;
      return;
    }
    if (in_ESI != 2) {
      if (in_ESI == 3) {
        ValueConverter<std::complex<double>_>::interpret((data_view *)in_stack_fffffffffffffe70);
        dVar3 = std::abs<double>((complex<double> *)in_stack_fffffffffffffe70);
        *in_RDX = dVar3 != 0.0;
        return;
      }
      if (in_ESI == 4) {
        ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret
                  (in_stack_fffffffffffffe88);
        dVar3 = vectorNorm((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe80);
        *in_RDX = dVar3 != 0.0;
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe80);
        return;
      }
      if (in_ESI == 5) {
        vec = local_118;
        ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
        interpret(in_stack_fffffffffffffe88);
        dVar3 = vectorNorm(vec);
        *in_RDX = dVar3 != 0.0;
        std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector(vec);
        return;
      }
      if (in_ESI == 6) {
        ValueConverter<helics::NamedPoint>::interpret(in_stack_fffffffffffffe88);
        local_b8 = local_b0;
        bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x427dec);
        bVar4 = true;
        if (!bVar1) {
          local_c8 = std::__cxx11::string::operator_cast_to_basic_string_view
                               (in_stack_fffffffffffffe70);
          val_01._M_str = in_stack_fffffffffffffe78;
          val_01._M_len = (size_t)in_stack_fffffffffffffe70;
          bVar4 = helicsBoolValue(val_01);
        }
        *in_RDX = bVar4;
        if ((((*in_RDX & 1) != 0) &&
            (((bVar1 = std::operator==(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68), bVar1
              || (bVar1 = CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)0x427e8e), bVar1)) && (local_90 == 0.0)))) &&
           (!NAN(local_90))) {
          *in_RDX = 0;
        }
        NamedPoint::~NamedPoint((NamedPoint *)0x427eea);
        return;
      }
      if (in_ESI == 7) {
        ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::interpret
                  ((data_view *)in_stack_fffffffffffffe70);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        __x._M_str._0_5_ = in_stack_fffffffffffffea0;
        __x._M_len = in_stack_fffffffffffffe98;
        __x._M_str._5_1_ = in_stack_fffffffffffffea5;
        __x._M_str._6_1_ = in_stack_fffffffffffffea6;
        __x._M_str._7_1_ = in_stack_fffffffffffffea7;
        __y._M_str = in_stack_fffffffffffffe90;
        __y._M_len = (size_t)in_stack_fffffffffffffe88;
        bVar1 = std::operator==(__x,__y);
        *in_RDX = (bVar1 ^ 0xffU) & 1;
        return;
      }
      if (in_ESI != 8) {
        if (in_ESI != 9) {
          if (in_ESI == 0x19) {
            this = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(this,"unrecognized helics type");
            __cxa_throw(this,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          if (in_ESI == 0x1e) {
            readJsonValue_abi_cxx11_
                      ((data_view *)
                       val_dv.
                       super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                       .
                       super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                       .
                       super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                       .
                       super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                       .
                       super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                       .
                       super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                       ._M_u._24_8_);
            valueExtract(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
            std::
            variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
            ::~variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                        *)0x4280f5);
            return;
          }
          if (in_ESI == 0x62ae) {
            std::
            variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
            ::variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                       *)0x427c9b);
            valueExtract(auVar5._4_8_,auVar5._0_4_,in_stack_ffffffffffffff80);
            valueExtract(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
            std::
            variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
            ::~variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                        *)0x427cda);
            return;
          }
        }
        goto LAB_00427d07;
      }
    }
    lVar2 = ValueConverter<long>::interpret((data_view *)in_stack_fffffffffffffe70);
    *in_RDX = lVar2 != 0;
  }
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, bool& val)
{
    switch (baseType) {
        case DataType::HELICS_ANY: {
            defV val_dv;
            valueExtract(data, baseType, val_dv);
            valueExtract(val_dv, val);
            break;
        }
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default:
            val = helicsBoolValue(ValueConverter<std::string_view>::interpret(data));
            break;
        case DataType::HELICS_BOOL:
            val = (ValueConverter<std::string_view>::interpret(data) != "0");
            break;
        case DataType::HELICS_NAMED_POINT: {
            auto npval = ValueConverter<NamedPoint>::interpret(data);
            auto& str = npval.name;
            val = str.empty() || helicsBoolValue(str);
            if (val) {
                if ((str == "value" || str.empty()) && npval.value == 0.0) {
                    val = false;
                }
            }

            break;
        }
        case DataType::HELICS_DOUBLE: {
            auto value = ValueConverter<double>::interpret(data);
            val = std::abs(value) != 0;
            break;
        }
        case DataType::HELICS_INT:
        case DataType::HELICS_TIME: {
            auto value = ValueConverter<int64_t>::interpret(data);
            val = (value != 0);
            break;
        }

        case DataType::HELICS_VECTOR: {
            auto value = ValueConverter<std::vector<double>>::interpret(data);
            val = (vectorNorm(value) != 0.0);
            break;
        }
        case DataType::HELICS_COMPLEX: {
            auto value = ValueConverter<std::complex<double>>::interpret(data);
            val = (std::abs(value) != 0.0);
            break;
        }
        case DataType::HELICS_COMPLEX_VECTOR: {
            auto value = ValueConverter<std::vector<std::complex<double>>>::interpret(data);
            val = (vectorNorm(value) != 0.0);
            break;
        }
        case DataType::HELICS_JSON:
            valueExtract(readJsonValue(data), val);
            break;
        case DataType::HELICS_CUSTOM:
            throw(std::invalid_argument("unrecognized helics type"));
    }
}